

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WorkerFlow.cpp
# Opt level: O2

bool __thiscall WorkerFlow::work(WorkerFlow *this)

{
  bool bVar1;
  int iVar2;
  int *piVar3;
  ostream *poVar4;
  char *pcVar5;
  zmq_pollitem_t items [2];
  
  items[0].socket = this->m_stream_socket;
  items[0].fd = 0;
  items[0].events = 1;
  items[0].revents = 0;
  items[1].socket = this->m_notif_socket;
  items[1].fd = 0;
  items[1].events = 1;
  items[1].revents = 0;
  while( true ) {
    iVar2 = zmq_poll(items,2,0xffffffffffffffff);
    if (iVar2 != -1) break;
    piVar3 = __errno_location();
    if (*piVar3 != 4) break;
    poVar4 = std::operator<<((ostream *)&std::cout,"zmq_poll: retrying");
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  if ((items[0]._8_8_ & 0x1000000000000) == 0) {
    if ((items[1]._8_8_ & 0x1000000000000) == 0) {
      poVar4 = std::operator<<((ostream *)&std::cout,"Panic! > ");
      piVar3 = __errno_location();
      pcVar5 = strerror(*piVar3);
      poVar4 = std::operator<<(poVar4,pcVar5);
      std::endl<char,std::char_traits<char>>(poVar4);
      bVar1 = false;
    }
    else {
      bVar1 = recv_notif(this);
    }
  }
  else {
    recv_stream(this);
    bVar1 = true;
  }
  return bVar1;
}

Assistant:

bool WorkerFlow::work()
{
    // zmq_pollitem_t.socket  = zmq obscure socket
    // zmq_pollitem_t.fd      = socket fd
    // zmq_pollitem_t.events  = what to poll
    // zmq_pollitem_t.revents = what was catched
    zmq_pollitem_t items[] = {
        { m_stream_socket, 0, ZMQ_POLLIN, 0 },
        { m_notif_socket,  0, ZMQ_POLLIN, 0 }
    };
    // Wait until there is data to read in either channel
    int timeout = -1; // return inmediatly
    while (zmq_poll(items, 2, timeout) == -1 && errno == EINTR) {
        std::cout << "zmq_poll: retrying" << std::endl;
    }

    // Multiplex channels
    // If stream socket has data to read
    if (items[0].revents & ZMQ_POLLIN) {
        return recv_stream();
    }
    // If notification channel has data to read
    if (items[1].revents & ZMQ_POLLIN) {
        return recv_notif();
    }
    
    // zmq_poll failed with errno != EINTR
    std::cout << "Panic! > " << strerror(errno) << std::endl;
    return false;
}